

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_module_registry.cpp
# Opt level: O1

int __thiscall sc_core::sc_module_registry::remove(sc_module_registry *this,char *__filename)

{
  pointer *pppsVar1;
  pointer ppsVar2;
  int extraout_EAX;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  
  ppsVar2 = (this->m_module_vec).
            super__Vector_base<sc_core::sc_module_*,_std::allocator<sc_core::sc_module_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  uVar4 = (ulong)((long)(this->m_module_vec).
                        super__Vector_base<sc_core::sc_module_*,_std::allocator<sc_core::sc_module_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppsVar2) >> 3;
  uVar3 = (uint)uVar4;
  if ((int)uVar3 < 1) {
    uVar5 = 0;
  }
  else {
    uVar5 = 0;
    do {
      if (ppsVar2[uVar5] == (sc_module *)__filename) goto LAB_001f8629;
      uVar5 = uVar5 + 1;
    } while ((uVar3 & 0x7fffffff) != uVar5);
    uVar5 = uVar4 & 0xffffffff;
  }
LAB_001f8629:
  if ((uint)uVar5 == uVar3) {
    sc_report_handler::report
              (SC_ERROR,"remove module failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ucirvinelecs[P]systemc/src/sysc/kernel/sc_module_registry.cpp"
               ,0x52);
    return extraout_EAX;
  }
  ppsVar2[uVar5 & 0xffffffff] =
       (this->m_module_vec).
       super__Vector_base<sc_core::sc_module_*,_std::allocator<sc_core::sc_module_*>_>._M_impl.
       super__Vector_impl_data._M_finish[-1];
  pppsVar1 = &(this->m_module_vec).
              super__Vector_base<sc_core::sc_module_*,_std::allocator<sc_core::sc_module_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  *pppsVar1 = *pppsVar1 + -1;
  return (int)ppsVar2;
}

Assistant:

void
sc_module_registry::remove( sc_module& module_ )
{
    int i;
    for( i = 0; i < size(); ++ i ) {
	if( &module_ == m_module_vec[i] ) {
	    break;
	}
    }
    if( i == size() ) {
        SC_REPORT_ERROR( SC_ID_REMOVE_MODULE_, 0 );
        return;
    }

    // remove
    m_module_vec[i] = m_module_vec.back();
    m_module_vec.pop_back();
}